

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tasks.cpp
# Opt level: O2

Task * AI::create_ChaseLastKnownHeading(void)

{
  Task *in_RDI;
  allocator<char> local_771;
  string local_770;
  string local_750;
  string local_730;
  undefined1 local_710 [120];
  vector<ConsumableFact,_std::allocator<ConsumableFact>_> local_698 [3];
  vector<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>
  local_650 [18];
  Action local_4a0;
  _Any_data local_498;
  pointer local_488;
  pointer pRStack_480;
  _Any_data local_478;
  pointer local_468;
  pointer pRStack_460;
  vector<Math::Vector3,_std::allocator<Math::Vector3>_> local_3f0;
  vector<float,_std::allocator<float>_> local_3d8 [2];
  Task stopMoving;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_730,"chaseHeading",(allocator<char> *)local_710);
  Task::Task(in_RDI,&local_730,Compound);
  std::__cxx11::string::~string((string *)&local_730);
  in_RDI->identifier = ChaseLastKnownHeading;
  local_710._0_4_ = Boredom;
  std::vector<ConsumableFact,_std::allocator<ConsumableFact>_>::emplace_back<ConsumableFact>
            (&(in_RDI->preconditions).consumableVectors,(ConsumableFact *)local_710);
  local_710._0_4_ = PlayerIdentified;
  local_710[4] = false;
  std::vector<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>::emplace_back<AI::RequiredFlag>
            ((vector<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_> *)in_RDI,
             (RequiredFlag *)local_710);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_750,"moveAlongHeading",(allocator<char> *)&stopMoving);
  Task::Task((Task *)local_710,&local_750,Simple);
  std::__cxx11::string::~string((string *)&local_750);
  stopMoving.preconditions.requiredFlags.
  super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(stopMoving.preconditions.requiredFlags.
                         super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>.
                         _M_impl.super__Vector_impl_data._M_start._4_4_,0x43a00000);
  std::vector<float,_std::allocator<float>_>::emplace_back<float>(local_3d8,(float *)&stopMoving);
  stopMoving.preconditions.requiredFlags.
  super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(stopMoving.preconditions.requiredFlags.
                         super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>.
                         _M_impl.super__Vector_impl_data._M_start._4_4_,0x447a0000);
  std::vector<float,_std::allocator<float>_>::emplace_back<float>(local_3d8,(float *)&stopMoving);
  stopMoving.preconditions.requiredFlags.
  super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  stopMoving.preconditions.requiredFlags.
  super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)CONCAT44(stopMoving.preconditions.requiredFlags.
                         super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>.
                         _M_impl.super__Vector_impl_data._M_finish._4_4_,0x3f800000);
  std::vector<Math::Vector3,_std::allocator<Math::Vector3>_>::emplace_back<Math::Vector3>
            (&local_3f0,(Vector3 *)&stopMoving);
  stopMoving.preconditions.requiredFlags.
  super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(stopMoving.preconditions.requiredFlags.
                         super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>.
                         _M_impl.super__Vector_impl_data._M_start._4_4_,1);
  std::vector<ConsumableFact,_std::allocator<ConsumableFact>_>::emplace_back<ConsumableFact>
            (local_698,(ConsumableFact *)&stopMoving);
  stopMoving.preconditions.requiredFlags.
  super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_488;
  local_4a0 = MoveToDestination;
  stopMoving.preconditions.requiredFlags.
  super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_498._M_unused._0_8_;
  stopMoving.preconditions.requiredFlags.
  super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_498._8_8_;
  local_498._M_unused._M_object = (void *)0x0;
  local_498._8_8_ = 0;
  local_488 = (pointer)std::
                       _Function_handler<void_(AI::Task_&,_AI::WorldState_&,_const_AI::WorldQuerier_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/patrick-lafferty[P]aitu/Tasks.cpp:368:28)>
                       ::_M_manager;
  stopMoving.preconditions.requiredValues.
  super__Vector_base<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>._M_impl.
  super__Vector_impl_data._M_start = pRStack_480;
  pRStack_480 = (pointer)std::
                         _Function_handler<void_(AI::Task_&,_AI::WorldState_&,_const_AI::WorldQuerier_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/patrick-lafferty[P]aitu/Tasks.cpp:368:28)>
                         ::_M_invoke;
  std::_Function_base::~_Function_base((_Function_base *)&stopMoving);
  stopMoving.preconditions.requiredFlags.
  super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xffffffff00000001;
  std::vector<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>::
  emplace_back<AI::SatisfiablePredicateParams>(local_650,(SatisfiablePredicateParams *)&stopMoving);
  stopMoving.preconditions.requiredFlags.
  super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_468;
  stopMoving.preconditions.requiredFlags.
  super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_478._M_unused._0_8_;
  stopMoving.preconditions.requiredFlags.
  super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_478._8_8_;
  local_478._M_unused._M_object = (void *)0x0;
  local_478._8_8_ = 0;
  local_468 = (pointer)std::
                       _Function_handler<void_(AI::WorldState_&,_AI::Task_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/patrick-lafferty[P]aitu/Tasks.cpp:378:29)>
                       ::_M_manager;
  stopMoving.preconditions.requiredValues.
  super__Vector_base<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>._M_impl.
  super__Vector_impl_data._M_start = pRStack_460;
  pRStack_460 = (pointer)std::
                         _Function_handler<void_(AI::WorldState_&,_AI::Task_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/patrick-lafferty[P]aitu/Tasks.cpp:378:29)>
                         ::_M_invoke;
  std::_Function_base::~_Function_base((_Function_base *)&stopMoving);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_770,"stopMoving",&local_771);
  Task::Task(&stopMoving,&local_770,Simple);
  std::__cxx11::string::~string((string *)&local_770);
  stopMoving.action = StopMoving;
  Task::addSubtask(in_RDI,(Task *)local_710);
  Task::addSubtask(in_RDI,&stopMoving);
  Task::~Task(&stopMoving);
  Task::~Task((Task *)local_710);
  return in_RDI;
}

Assistant:

Task create_ChaseLastKnownHeading()
	{
		/*
		1 - move to last known location
		2 - move X distance along heading
		*/

		Task chaseHeading {"chaseHeading", TaskType::Compound};
		chaseHeading.identifier = TaskIdentifier::ChaseLastKnownHeading;
		chaseHeading.preconditions.consumableVectors.push_back(ConsumableFact::Player_ForwardVector);
		chaseHeading.preconditions.requiredFlags.push_back({WorldStateIdentifier::PlayerIdentified, false});

		Task moveAlongHeading {"moveAlongHeading"};
		//amount to move along heading
		//note: should change based when alt paths appear, such as hallway with other paths 
		moveAlongHeading.parameters.values.push_back(320);
		moveAlongHeading.parameters.values.push_back(1000);
		moveAlongHeading.parameters.vectors.push_back({0.f, 0.f, 1.f});
		moveAlongHeading.preconditions.consumableVectors.push_back(ConsumableFact::Player_ForwardVector);
		moveAlongHeading.action = Action::MoveToDestination;		
		moveAlongHeading.setup = [=](Task& task, WorldState& state, const WorldQuerier&)
		{
			auto& currentPosition = state.current.vectors[WorldStateIdentifier::CurrentPosition];
			auto playerForwardVector = state.facts.vectors[ConsumableFact::Player_ForwardVector].value;

			auto destination = currentPosition + playerForwardVector * task.parameters.values[1];
			state.current.vectors[WorldStateIdentifier::Destination] = destination;
		};

		moveAlongHeading.postconditions.satisfiedPredicates.push_back({SatisfiablePredicateIdentifier::NearDestination, -1});
		moveAlongHeading.finish = [](WorldState& state, Task& task)
		{
			state.consumeFactVector(ConsumableFact::Player_ForwardVector);
		};

		Task stopMoving {"stopMoving"};
		stopMoving.action = Action::StopMoving;

		chaseHeading.addSubtask(moveAlongHeading);
		chaseHeading.addSubtask(stopMoving);		

		return chaseHeading;
	}